

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O2

CVmUndoRecord * __thiscall CVmUndo::add_new_record(CVmUndo *this,vm_obj_id_t controlling_obj)

{
  int iVar1;
  CVmUndoMeta *pCVar2;
  
  if (this->savept_cnt_ != 0) {
    iVar1 = CVmObjTable::is_obj_in_undo(&G_obj_table_X,controlling_obj);
    if (iVar1 != 0) {
      pCVar2 = alloc_rec(this);
      return (CVmUndoRecord *)pCVar2;
    }
  }
  return (CVmUndoRecord *)0x0;
}

Assistant:

CVmUndoRecord *CVmUndo::add_new_record(VMG_ vm_obj_id_t controlling_obj)
{
    CVmUndoMeta *meta;
    
    /* if there is not an active savepoint, do not keep undo */
    if (savept_cnt_ == 0)
        return 0;

    /* 
     *   if the object was created after the current savepoint was created,
     *   there is no need to keep undo for it during this savepoint, since
     *   rolling back to the savepoint will roll back to a point at which
     *   the object didn't even exist 
     */
    if (!G_obj_table->is_obj_in_undo(controlling_obj))
        return 0;
    
    /* allocate a new record */
    meta = alloc_rec(vmg0_);
    
    /* return the undo record, if we succeeded */
    return (meta == 0 ? 0 : &meta->rec);
}